

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Texture.h
# Opt level: O0

Vec3 __thiscall ImageTexture::GetValue(ImageTexture *this,float u,float v,Vec3 *pos)

{
  float *pfVar1;
  int iVar2;
  int iVar3;
  long in_RSI;
  Vec3 *in_RDI;
  float in_XMM0_Da;
  float e1;
  undefined8 extraout_XMM0_Qa;
  float in_XMM1_Da;
  Vec3 VVar4;
  float _b;
  float _g;
  float _r;
  int _j3_width;
  int _i3;
  int _j;
  int _i;
  float local_40;
  float local_3c;
  float local_38;
  int local_34;
  float local_30;
  float local_2c;
  float local_28;
  int local_24;
  float local_18;
  
  local_28 = 0.0;
  local_2c = (float)*(int *)(in_RSI + 8) - 1.0;
  local_30 = in_XMM0_Da * (float)*(int *)(in_RSI + 8);
  local_18 = in_XMM1_Da;
  pfVar1 = std::min<float>(&local_2c,&local_30);
  pfVar1 = std::max<float>(&local_28,pfVar1);
  local_24 = (int)*pfVar1;
  local_38 = 0.0;
  local_3c = (float)*(int *)(in_RSI + 0xc) - 1.0;
  local_40 = (1.0 - local_18) * (float)*(int *)(in_RSI + 0xc) + -0.001;
  pfVar1 = std::min<float>(&local_3c,&local_40);
  pfVar1 = std::max<float>(&local_38,pfVar1);
  local_34 = (int)*pfVar1;
  iVar2 = local_24 * 3;
  iVar3 = local_34 * 3 * *(int *)(in_RSI + 8);
  e1 = (float)*(byte *)(*(long *)(in_RSI + 0x10) + (long)(iVar2 + iVar3 + 1)) / 255.0;
  Vec3::Vec3(in_RDI,(float)*(byte *)(*(long *)(in_RSI + 0x10) + (long)(iVar2 + iVar3)) / 255.0,e1,
             (float)*(byte *)(*(long *)(in_RSI + 0x10) + (long)(iVar2 + iVar3 + 2)) / 255.0);
  VVar4.e[2] = e1;
  VVar4.e[0] = (float)(int)extraout_XMM0_Qa;
  VVar4.e[1] = (float)(int)((ulong)extraout_XMM0_Qa >> 0x20);
  return (Vec3)VVar4.e;
}

Assistant:

virtual Vec3 GetValue(float u, float v, const Vec3& pos) const override {
		int   _i		= (int)std::max(0.0f, std::min(m_width  - 1.0f, (u)*m_width));
		int   _j		= (int)std::max(0.0f, std::min(m_height - 1.0f, (1.0f - v)*m_height - 0.001f));

		int	  _i3       = _i * 3;
		int	  _j3_width = _j * 3 * m_width;
		float _r		= int(m_data[_i3 + _j3_width]    ) / 255.0f;
		float _g		= int(m_data[_i3 + _j3_width + 1]) / 255.0f;
		float _b		= int(m_data[_i3 + _j3_width + 2]) / 255.0f;

		return Vec3(_r, _g, _b);
	}